

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (String *__return_storage_ptr__,detail *this,
          duration<long,_std::ratio<1L,_1000000000L>_> *lhs,char *op,
          duration<long,_std::ratio<1L,_1000000000L>_> *rhs)

{
  duration<long,_std::ratio<1L,_1000000000L>_> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  StringMakerBase<true>::convert<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&local_48,(StringMakerBase<true> *)this,lhs);
  String::String(&local_60,(char *)lhs);
  String::operator+(&local_30,&local_48,&local_60);
  StringMakerBase<true>::convert<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&SStack_78,(StringMakerBase<true> *)op,in);
  String::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }